

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswBmc.c
# Opt level: O1

Aig_Obj_t * Ssw_BmcUnroll_rec(Ssw_Frm_t *pFrm,Aig_Obj_t *pObj,int f)

{
  ulong uVar1;
  int iVar2;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  long lVar6;
  void **ppvVar7;
  uint uVar8;
  int iVar9;
  size_t __size;
  int iVar10;
  int iVar11;
  
  pAVar5 = Ssw_ObjFrame_(pFrm,pObj,f);
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    return pAVar5;
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar8 = uVar4 & 7;
  if (uVar8 == 1) {
    pAVar5 = pFrm->pFrames->pConst1;
  }
  else {
    p = pFrm->pAig;
    if ((uVar8 == 2) && ((pObj->field_0).CioId < p->nTruePis)) {
      pAVar5 = Aig_ObjCreateCi(pFrm->pFrames);
    }
    else if (uVar8 == 3) {
      Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      pAVar5 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      if (pAVar5 == (Aig_Obj_t *)0x0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = Ssw_ObjFrame_(pFrm,pAVar5,f);
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pAVar5);
      }
    }
    else if ((uVar8 == 2) && (p->nTruePis <= (pObj->field_0).CioId)) {
      if (f == 0) {
        pAVar5 = (Aig_Obj_t *)((ulong)pFrm->pFrames->pConst1 ^ 1);
      }
      else {
        pAVar5 = Saig_ObjLoToLi(p,pObj);
        pAVar5 = Ssw_BmcUnroll_rec(pFrm,pAVar5,f + -1);
      }
    }
    else {
      if ((uVar4 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswBmc.c"
                      ,0x44,"Aig_Obj_t *Ssw_BmcUnroll_rec(Ssw_Frm_t *, Aig_Obj_t *, int)");
      }
      Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
      pAVar5 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
      p1 = Ssw_ObjChild1Fra_(pFrm,pObj,f);
      pAVar5 = Aig_And(pFrm->pFrames,pAVar5,p1);
    }
  }
  pVVar3 = pFrm->vAig2Frm;
  lVar6 = (long)f * (long)pFrm->nObjs;
  uVar1 = lVar6 + pObj->Id;
  iVar9 = (int)uVar1;
  if (iVar9 < pVVar3->nSize) goto LAB_005da9b3;
  lVar6 = lVar6 + pObj->Id + 1;
  iVar2 = pVVar3->nCap;
  iVar11 = iVar2 * 2;
  iVar10 = (int)lVar6;
  if (iVar9 < iVar11) {
    if (iVar2 < iVar11 && iVar2 <= iVar9) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((long)iVar2 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,(long)iVar2 << 4);
      }
      pVVar3->pArray = ppvVar7;
LAB_005da98c:
      pVVar3->nCap = iVar11;
    }
  }
  else if (iVar2 <= iVar9) {
    __size = lVar6 * 8;
    if (pVVar3->pArray == (void **)0x0) {
      ppvVar7 = (void **)malloc(__size);
    }
    else {
      ppvVar7 = (void **)realloc(pVVar3->pArray,__size);
    }
    pVVar3->pArray = ppvVar7;
    iVar11 = iVar10;
    goto LAB_005da98c;
  }
  lVar6 = (long)pVVar3->nSize;
  if (pVVar3->nSize <= iVar9) {
    do {
      pVVar3->pArray[lVar6] = (void *)0x0;
      lVar6 = lVar6 + 1;
    } while (iVar10 != lVar6);
  }
  pVVar3->nSize = iVar10;
LAB_005da9b3:
  if ((-1 < iVar9) && (iVar9 < pVVar3->nSize)) {
    pVVar3->pArray[uVar1 & 0xffffffff] = pAVar5;
    return pAVar5;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Incrementally unroll the timeframes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Ssw_BmcUnroll_rec( Ssw_Frm_t * pFrm, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pRes, * pRes0, * pRes1;
    if ( (pRes = Ssw_ObjFrame_(pFrm, pObj, f)) )
        return pRes;
    if ( Aig_ObjIsConst1(pObj) )
        pRes = Aig_ManConst1( pFrm->pFrames );
    else if ( Saig_ObjIsPi(pFrm->pAig, pObj) )
        pRes = Aig_ObjCreateCi( pFrm->pFrames );
    else if ( Aig_ObjIsCo(pObj) )
    {
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        pRes = Ssw_ObjChild0Fra_( pFrm, pObj, f );
    }
    else if ( Saig_ObjIsLo(pFrm->pAig, pObj) )
    {
        if ( f == 0 )
            pRes = Aig_ManConst0( pFrm->pFrames );
        else
            pRes = Ssw_BmcUnroll_rec( pFrm, Saig_ObjLoToLi(pFrm->pAig, pObj), f-1 );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin1(pObj), f );
        pRes0 = Ssw_ObjChild0Fra_( pFrm, pObj, f );
        pRes1 = Ssw_ObjChild1Fra_( pFrm, pObj, f );
        pRes = Aig_And( pFrm->pFrames, pRes0, pRes1 );
    }
    Ssw_ObjSetFrame_( pFrm, pObj, f, pRes );
    return pRes;
}